

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

void MercuryJson::__error_maybe_escape(char *context,size_t *length,char ch)

{
  size_t sVar1;
  char ch_local;
  size_t *length_local;
  char *context_local;
  
  if (ch == '\0') {
    sVar1 = *length;
    *length = sVar1 + 1;
    context[sVar1] = '\"';
  }
  else if (((ch == '\t') || (ch == '\n')) || (ch == '\b')) {
    sVar1 = *length;
    *length = sVar1 + 1;
    context[sVar1] = '\\';
    if (ch == '\b') {
      sVar1 = *length;
      *length = sVar1 + 1;
      context[sVar1] = 'b';
    }
    else if (ch == '\t') {
      sVar1 = *length;
      *length = sVar1 + 1;
      context[sVar1] = 't';
    }
    else if (ch == '\n') {
      sVar1 = *length;
      *length = sVar1 + 1;
      context[sVar1] = 'n';
    }
  }
  else {
    sVar1 = *length;
    *length = sVar1 + 1;
    context[sVar1] = ch;
  }
  return;
}

Assistant:

void __error_maybe_escape(char *context, size_t *length, char ch) {
        if (ch == '\0') {
            context[(*length)++] = '"';
        } else if (ch == '\t' || ch == '\n' || ch == '\b') {
            context[(*length)++] = '\\';
            switch (ch) {
                case '\t':
                    context[(*length)++] = 't';
                    break;
                case '\n':
                    context[(*length)++] = 'n';
                    break;
                case '\b':
                    context[(*length)++] = 'b';
                    break;
                default:
                    break;
            }
        } else {
            context[(*length)++] = ch;
        }
    }